

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O2

void __thiscall
visitor_test_should_stop_when_encountering_invalid_fix_version_Test::TestBody
          (visitor_test_should_stop_when_encountering_invalid_fix_version_Test *this)

{
  char *message;
  char *in_R9;
  undefined1 local_a8 [8];
  VisitError<typename_AssertVisitor::ResultType> error;
  ErrorKind errorKind;
  AssertionResult gtest_ar_;
  AssertHelper local_20;
  
  doVisit<AssertVisitor,AssertVisitRules>(local_a8,"8=FIX.5.1|9=0000|35=0|49=Prov|56=MDABC|10=213");
  errorKind.str_.field_2._M_local_buf[8] = local_a8[0] ^ 1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_a8[0] == true) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&error.storage_.initialized_,
               (internal *)(errorKind.str_.field_2._M_local_buf + 8),
               (AssertionResult *)"error.isOk()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,799,(char *)CONCAT44(error.storage_._52_4_,error.storage_._48_4_));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    std::__cxx11::string::~string((string *)&error.storage_.initialized_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
    Fixpp::result::Result<void,_Fixpp::ErrorKind>::unwrapErr
              ((ErrorKind *)&error.storage_.initialized_,(Result<void,_Fixpp::ErrorKind> *)local_a8)
    ;
    gtest_ar_.message_.ptr_._0_1_ = error.storage_.initialized_;
    gtest_ar_.message_.ptr_._1_3_ = error.storage_._49_3_;
    local_20.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<Fixpp::ErrorKind::Type,Fixpp::ErrorKind::Type>
              ((internal *)(errorKind.str_.field_2._M_local_buf + 8),"errorKind.type()",
               "Fixpp::ErrorKind::InvalidVersion",(Type *)&gtest_ar_.message_,(Type *)&local_20);
    if (errorKind.str_.field_2._M_local_buf[8] == '\0') {
      testing::Message::Message((Message *)&gtest_ar_.message_);
      if (gtest_ar_._0_8_ == 0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x322,message);
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar_.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_.message_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&errorKind.column_);
  }
  Fixpp::result::Result<void,_Fixpp::ErrorKind>::~Result((Result<void,_Fixpp::ErrorKind> *)local_a8)
  ;
  return;
}

Assistant:

TEST(visitor_test, should_stop_when_encountering_invalid_fix_version)
{
    const char* frame = "8=FIX.5.1|9=0000|35=0|49=Prov|56=MDABC|10=213";

    auto error = doVisit(frame, AssertVisitor(), AssertVisitRules());
    ASSERT_FALSE(error.isOk());

    auto errorKind = error.unwrapErr();
    ASSERT_EQ(errorKind.type(), Fixpp::ErrorKind::InvalidVersion);
}